

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

CopyStatus adios2sys::SystemTools::CopyFileContentBlockwise(string *source,string *destination)

{
  long lVar1;
  Status SVar2;
  WhichPath WVar3;
  CopyStatus CVar4;
  ofstream fout;
  ifstream fin;
  char buffer [4096];
  long local_1430;
  filebuf local_1428 [24];
  byte abStack_1410 [216];
  ios_base local_1338 [264];
  long local_1230;
  long local_1228;
  byte abStack_1210 [488];
  undefined1 local_1028 [4104];
  
  std::ifstream::ifstream(&local_1230,(source->_M_dataplus)._M_p,_S_in|_S_bin);
  if ((abStack_1210[*(long *)(local_1230 + -0x18)] & 5) != 0) {
    SVar2 = Status::POSIX_errno();
    WVar3 = SourcePath;
    goto LAB_0072fcd5;
  }
  RemoveFile(destination);
  std::ofstream::ofstream(&local_1430,(destination->_M_dataplus)._M_p,_S_trunc|_S_out|_S_bin);
  if ((abStack_1410[*(long *)(local_1430 + -0x18)] & 5) == 0) {
    do {
      if ((abStack_1210[*(long *)(local_1230 + -0x18)] & 5) != 0) break;
      std::istream::read((char *)&local_1230,(long)local_1028);
      lVar1 = local_1228;
      if (local_1228 == 0) break;
      std::ostream::write((char *)&local_1430,(long)local_1028);
    } while (lVar1 != 0);
    std::ostream::flush();
    std::ifstream::close();
    std::ofstream::close();
    if ((abStack_1410[*(long *)(local_1430 + -0x18)] & 5) != 0) goto LAB_0072fc95;
    WVar3 = NoPath;
    SVar2.Kind_ = Success;
    SVar2.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
  }
  else {
LAB_0072fc95:
    SVar2 = Status::POSIX_errno();
    WVar3 = DestPath;
  }
  local_1430 = _VTT;
  *(undefined8 *)(local_1428 + *(long *)(_VTT + -0x18) + -8) = _pthread_rwlock_init;
  std::filebuf::~filebuf(local_1428);
  std::ios_base::~ios_base(local_1338);
LAB_0072fcd5:
  std::ifstream::~ifstream(&local_1230);
  CVar4.Path = WVar3;
  CVar4.super_Status = SVar2;
  return CVar4;
}

Assistant:

SystemTools::CopyStatus SystemTools::CopyFileContentBlockwise(
  std::string const& source, std::string const& destination)
{
  // Open files
  kwsys::ifstream fin(source.c_str(), std::ios::in | std::ios::binary);
  if (!fin) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::SourcePath };
  }

  // try and remove the destination file so that read only destination files
  // can be written to.
  // If the remove fails continue so that files in read only directories
  // that do not allow file removal can be modified.
  SystemTools::RemoveFile(destination);

  kwsys::ofstream fout(destination.c_str(),
                       std::ios::out | std::ios::trunc | std::ios::binary);
  if (!fout) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::DestPath };
  }

  // This copy loop is very sensitive on certain platforms with
  // slightly broken stream libraries (like HPUX).  Normally, it is
  // incorrect to not check the error condition on the fin.read()
  // before using the data, but the fin.gcount() will be zero if an
  // error occurred.  Therefore, the loop should be safe everywhere.
  while (fin) {
    const int bufferSize = 4096;
    char buffer[bufferSize];

    fin.read(buffer, bufferSize);
    if (fin.gcount()) {
      fout.write(buffer, fin.gcount());
    } else {
      break;
    }
  }

  // Make sure the operating system has finished writing the file
  // before closing it.  This will ensure the file is finished before
  // the check below.
  fout.flush();

  fin.close();
  fout.close();

  if (!fout) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::DestPath };
  }

  return CopyStatus{ Status::Success(), CopyStatus::NoPath };
}